

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

bool __thiscall
glslang::TParseContext::arrayQualifierError
          (TParseContext *this,TSourceLoc *loc,TQualifier *qualifier)

{
  uint uVar1;
  
  uVar1 = (uint)*(undefined8 *)&qualifier->field_0x8;
  if ((uVar1 & 0x7f) == 2) {
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,1,0x78,"GL_3DL_array_objects","const array");
    TParseVersions::profileRequires((TParseVersions *)this,loc,8,300,(char *)0x0,"const array");
    uVar1 = (uint)*(undefined8 *)&qualifier->field_0x8;
  }
  if (((uVar1 & 0x7f) == 3) &&
     ((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex)) {
    TParseVersions::requireProfile((TParseVersions *)this,loc,-9,"vertex input arrays");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,1,0x96,(char *)0x0,"vertex input arrays");
  }
  return false;
}

Assistant:

bool TParseContext::arrayQualifierError(const TSourceLoc& loc, const TQualifier& qualifier)
{
    if (qualifier.storage == EvqConst) {
        profileRequires(loc, ENoProfile, 120, E_GL_3DL_array_objects, "const array");
        profileRequires(loc, EEsProfile, 300, nullptr, "const array");
    }

    if (qualifier.storage == EvqVaryingIn && language == EShLangVertex) {
        requireProfile(loc, ~EEsProfile, "vertex input arrays");
        profileRequires(loc, ENoProfile, 150, nullptr, "vertex input arrays");
    }

    return false;
}